

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptStringObject::DeleteProperty
          (JavascriptStringObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ScriptContext *this_00;
  BOOL BVar1;
  PropertyRecord *pPVar2;
  
  if (propertyId == 0xd1) {
    this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
               ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    pPVar2 = ScriptContext::GetPropertyName(this_00,0xd1);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,this_00,(PCWSTR)(pPVar2 + 1));
    return 0;
  }
  BVar1 = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,flags);
  return BVar1;
}

Assistant:

BOOL JavascriptStringObject::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        if (propertyId == PropertyIds::length)
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());

            return FALSE;
        }
        return DynamicObject::DeleteProperty(propertyId, flags);
    }